

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReportErrorIfHasNoExtraArraynessForOtherEntry
          (InterfaceVariableScalarReplacement *this,Instruction *var)

{
  iterator iVar1;
  long *plVar2;
  size_t *psVar3;
  string message;
  Instruction *local_90;
  spv_position_t local_88;
  long lStack_70;
  long *local_60 [2];
  long local_50 [2];
  string local_40;
  
  local_90 = var;
  iVar1 = std::
          _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->vars_without_extra_arrayness)._M_h,&local_90);
  if (iVar1.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur !=
      (__node_type *)0x0) {
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_60,
               "A variable is not arrayed for an entry point but it is arrayed for another entry point"
               ,"");
    Instruction::PrettyPrint_abi_cxx11_(&local_40,local_90,0x40);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x7839a2);
    psVar3 = (size_t *)(plVar2 + 2);
    if ((size_t *)*plVar2 == psVar3) {
      local_88.index = *psVar3;
      lStack_70 = plVar2[3];
      local_88.line = (size_t)&local_88.index;
    }
    else {
      local_88.index = *psVar3;
      local_88.line = (size_t)*plVar2;
    }
    local_88.column = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_60,local_88.line);
    if ((size_t *)local_88.line != &local_88.index) {
      operator_delete((void *)local_88.line,local_88.index + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    local_88.line = 0;
    local_88.column = 0;
    local_88.index = 0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&((this->super_Pass).context_)->consumer_,SPV_MSG_ERROR,"",&local_88,
               (char *)local_60[0]);
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
  }
  return iVar1.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur !=
         (__node_type *)0x0;
}

Assistant:

bool InterfaceVariableScalarReplacement::
    ReportErrorIfHasNoExtraArraynessForOtherEntry(Instruction* var) {
  if (vars_without_extra_arrayness.find(var) ==
      vars_without_extra_arrayness.end())
    return false;

  std::string message(
      "A variable is not arrayed for an entry point but it is "
      "arrayed for another entry point");
  message +=
      "\n  " + var->PrettyPrint(SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
  context()->consumer()(SPV_MSG_ERROR, "", {0, 0, 0}, message.c_str());
  return true;
}